

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemdelegate.cpp
# Opt level: O0

int __thiscall
QAbstractItemDelegate::qt_metacall(QAbstractItemDelegate *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000020;
  int in_stack_00000028;
  Call in_stack_0000002c;
  QObject *in_stack_00000030;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 5) {
        qt_static_metacall(in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000020);
      }
      local_18 = local_18 + -5;
    }
    if (in_ESI == 7) {
      if (local_18 < 5) {
        qt_static_metacall(in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000020);
      }
      local_18 = local_18 + -5;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QAbstractItemDelegate::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    return _id;
}